

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O2

void SUNAdaptController_DestroyEmpty(SUNAdaptController C)

{
  if (C != (SUNAdaptController)0x0) {
    free(C->ops);
    free(C);
    return;
  }
  return;
}

Assistant:

void SUNAdaptController_DestroyEmpty(SUNAdaptController C)
{
  if (C == NULL) { return; }

  /* free non-NULL ops structure */
  if (C->ops) { free(C->ops); }
  C->ops = NULL;

  /* free overall SUNAdaptController object and return */
  free(C);
  return;
}